

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

int Ssw_RarManObjsAreEqual(void *pMan,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = *(int *)(*(long *)(*(long *)((long)pMan + 0x10) + 0x20) + 4);
  if ((pObj0->Id < iVar1) && (pObj1->Id < iVar1)) {
    uVar2 = *(uint *)(*pMan + 4);
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        if ((*(ulong *)(*(long *)((long)pMan + 0x28) + (long)(int)(pObj1->Id * uVar2) * 8 +
                       uVar3 * 8) ^
            *(ulong *)(*(long *)((long)pMan + 0x28) + (long)(int)(pObj0->Id * uVar2) * 8 + uVar3 * 8
                      )) !=
            (long)((ulong)(*(uint *)&pObj1->field_0x18 ^ *(uint *)&pObj0->field_0x18) << 0x3c) >>
            0x3f) {
          return 0;
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    return 1;
  }
  __assert_fail("Id < Aig_ManObjNumMax(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                ,0x53,"word *Ssw_RarObjSim(Ssw_RarMan_t *, int)");
}

Assistant:

int Ssw_RarManObjsAreEqual( void * pMan, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    word * pSim0 = Ssw_RarObjSim( p, pObj0->Id );
    word * pSim1 = Ssw_RarObjSim( p, pObj1->Id );
    word Flip = (pObj0->fPhase != pObj1->fPhase) ? ~(word)0 : 0;
    int w;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim0[w] ^ pSim1[w] ^ Flip )
            return 0;
    return 1;
}